

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O2

void Kit_TruthCountOnesInCofsSlow(uint *pTruth,int nVars,int *pStore,uint *pAux)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = 0;
  if (0 < nVars) {
    uVar2 = (ulong)(uint)nVars;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    Kit_TruthCofactor0New(pAux,pTruth,nVars,(int)uVar3);
    iVar1 = Kit_TruthCountOnes(pAux,nVars);
    pStore[uVar3 * 2] = iVar1 / 2;
    Kit_TruthCofactor1New(pAux,pTruth,nVars,(int)uVar3);
    iVar1 = Kit_TruthCountOnes(pAux,nVars);
    pStore[uVar3 * 2 + 1] = iVar1 / 2;
  }
  return;
}

Assistant:

void Kit_TruthCountOnesInCofsSlow( unsigned * pTruth, int nVars, int * pStore, unsigned * pAux )
{
    int i;
    for ( i = 0; i < nVars; i++ )
    {
        Kit_TruthCofactor0New( pAux, pTruth, nVars, i );
        pStore[2*i+0] = Kit_TruthCountOnes( pAux, nVars ) / 2;
        Kit_TruthCofactor1New( pAux, pTruth, nVars, i );
        pStore[2*i+1] = Kit_TruthCountOnes( pAux, nVars ) / 2;
    }
}